

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O2

void __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::unRef
          (KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *this)

{
  RefCounter *pRVar1;
  FixedDatum *pFVar2;
  
  if (this->m_pRef != (FixedDatum *)0x0) {
    pRVar1 = this->m_piCount;
    *pRVar1 = *pRVar1 - 1;
    if (*pRVar1 == 0) {
      operator_delete(pRVar1,2);
      pFVar2 = this->m_pRef;
      if (pFVar2 != (FixedDatum *)0x0) {
        (*(pFVar2->super_DataTypeBase)._vptr_DataTypeBase[1])();
      }
      this->m_pRef = (FixedDatum *)0x0;
      this->m_piCount = (RefCounter *)0x0;
    }
  }
  return;
}

Assistant:

void unRef()
    {
        if( m_pRef )
        {
            --( *m_piCount );
            if( *m_piCount == 0 )
            {
                delete m_piCount;
                delete m_pRef;
                m_piCount = NULL;
                m_pRef = NULL;
            }
        }
    }